

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t uVar9;
  HuffmanCode *pHVar10;
  size_t sVar11;
  ulong in_RSI;
  HuffmanCode *table;
  uint64_t uVar12;
  uint uVar13;
  HuffmanCode *table_00;
  bool bVar14;
  uint32_t block_type;
  uint32_t index;
  uint local_48;
  uint local_44;
  size_t local_40;
  uint64_t local_38;
  
  uVar3 = s->num_block_types[1];
  if (uVar3 < 2) {
    return 0;
  }
  br = &s->br;
  local_38 = (s->br).val_;
  uVar4 = (s->br).bit_pos_;
  puVar5 = (s->br).next_in;
  local_40 = (s->br).avail_in;
  bVar14 = uVar4 - 0x32 < 0xf;
  uVar9 = uVar4;
  if (bVar14) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar12 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      uVar7 = uVar4;
      do {
        uVar9 = uVar7 - 8;
        sVar11 = sVar11 - 1;
        in_RSI = uVar12 >> 8;
        (s->br).val_ = in_RSI;
        uVar12 = (ulong)*pbVar6 << 0x38 | uVar12 >> 8;
        (s->br).val_ = uVar12;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar6 + 1;
        bVar14 = uVar7 - 0x3a < 0xf;
        if (!bVar14) goto LAB_00105e32;
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar9;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_00105e32:
    in_RSI = (ulong)((uint)(br->val_ >> ((byte)uVar9 & 0x3f)) & 0x7fff);
  }
  table = s->block_type_trees + 0x278;
  table_00 = s->block_len_trees + 0x18c;
  if (bVar14) {
    iVar8 = SafeDecodeSymbol(table,br,&local_48);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar10 = table + (in_RSI & 0xff);
    bVar2 = pHVar10->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + 8;
      pHVar10 = pHVar10 + (ulong)pHVar10->value +
                          (ulong)((uint)(in_RSI >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar10->bits;
    local_48 = (uint)pHVar10->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar9 = (s->br).bit_pos_;
    bVar14 = uVar9 - 0x32 < 0xf;
    if (bVar14) {
      sVar11 = (s->br).avail_in;
      if (sVar11 != 0) {
        uVar12 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        uVar7 = uVar9;
        do {
          uVar9 = uVar7 - 8;
          sVar11 = sVar11 - 1;
          table = (HuffmanCode *)(uVar12 >> 8);
          (s->br).val_ = (uint64_t)table;
          uVar12 = (ulong)*pbVar6 << 0x38 | uVar12 >> 8;
          (s->br).val_ = uVar12;
          (s->br).bit_pos_ = uVar9;
          (s->br).avail_in = sVar11;
          (s->br).next_in = pbVar6 + 1;
          bVar14 = uVar7 - 0x3a < 0xf;
          if (!bVar14) goto LAB_00105f14;
          pbVar6 = pbVar6 + 1;
          uVar7 = uVar9;
        } while (sVar11 != 0);
      }
    }
    else {
LAB_00105f14:
      table = (HuffmanCode *)(ulong)((uint)(br->val_ >> ((byte)uVar9 & 0x3f)) & 0x7fff);
    }
    if (bVar14) {
      iVar8 = SafeDecodeSymbol(table_00,br,&local_44);
      if (iVar8 == 0) goto LAB_0010603a;
    }
    else {
      pHVar10 = table_00 + ((ulong)table & 0xff);
      bVar2 = pHVar10->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar10 = pHVar10 + (ulong)pHVar10->value +
                            (ulong)((uint)((ulong)table >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
      }
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + (uint)pHVar10->bits;
      local_44 = (uint)pHVar10->value;
    }
  }
  else {
    local_44 = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_44].nbits;
  uVar9 = (s->br).bit_pos_;
  bVar14 = 0x40 - uVar9 < (uint)bVar2;
  if (bVar14) {
    sVar11 = (s->br).avail_in;
    if (sVar11 != 0) {
      uVar12 = (s->br).val_;
      uVar13 = 0x48 - uVar9;
      pbVar6 = (s->br).next_in;
      do {
        uVar9 = uVar9 - 8;
        sVar11 = sVar11 - 1;
        (s->br).val_ = uVar12 >> 8;
        uVar12 = (ulong)*pbVar6 << 0x38 | uVar12 >> 8;
        (s->br).val_ = uVar12;
        (s->br).bit_pos_ = uVar9;
        (s->br).avail_in = sVar11;
        (s->br).next_in = pbVar6 + 1;
        bVar14 = uVar13 < bVar2;
        if (!bVar14) goto LAB_00105ff1;
        uVar13 = uVar13 + 8;
        pbVar6 = pbVar6 + 1;
      } while (sVar11 != 0);
    }
  }
  else {
LAB_00105ff1:
    table_00 = (HuffmanCode *)
               (ulong)((uint)((s->br).val_ >> ((byte)uVar9 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar9 + bVar2;
  }
  if (!bVar14) {
    s->block_length[1] = (int)table_00 + (uint)kBlockLengthPrefixCode[local_44].offset;
  }
  else {
    s->block_length_index = local_44;
  }
  s->substate_read_block_length = (uint)bVar14;
  if (!bVar14) {
    if (local_48 == 0) {
      local_48 = s->block_type_rb[2];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[3] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    if (uVar3 <= local_48) {
      local_48 = local_48 - uVar3;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = local_48;
    s->htree_command = (s->insert_copy_hgroup).htrees[local_48];
    return 1;
  }
LAB_0010603a:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = local_38;
  (s->br).bit_pos_ = uVar4;
  (s->br).next_in = puVar5;
  (s->br).avail_in = local_40;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}